

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.hpp
# Opt level: O2

int actorpp::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int iVar2;
  runtime_error *prVar3;
  undefined4 in_register_0000003c;
  addrinfo *res;
  string port_str;
  addrinfo hints;
  
  hints.ai_flags = 0;
  hints.ai_protocol = 0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_family = 2;
  hints.ai_socktype = 1;
  std::__cxx11::to_string(&port_str,(int)__addr);
  iVar1 = getaddrinfo(*(char **)CONCAT44(in_register_0000003c,__fd),port_str._M_dataplus._M_p,
                      (addrinfo *)&hints,(addrinfo **)&res);
  if ((iVar1 == 0) && (res != (addrinfo *)0x0)) {
    iVar1 = socket(res->ai_family,res->ai_socktype,0);
    if (iVar1 < 0) {
      freeaddrinfo((addrinfo *)res);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"failed to allocate socket");
    }
    else {
      iVar2 = ::connect(iVar1,(sockaddr *)res->ai_addr,res->ai_addrlen);
      if (iVar2 == 0) {
        freeaddrinfo((addrinfo *)res);
        std::__cxx11::string::~string((string *)&port_str);
        return iVar1;
      }
      close(iVar1);
      freeaddrinfo((addrinfo *)res);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"failed to connect");
    }
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"dns lookup failed");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int connect(const std::string &hostname, int port) {
  struct addrinfo hints;
  memset(&hints, 0, sizeof(hints));
  hints.ai_family = AF_INET;
  hints.ai_socktype = SOCK_STREAM;
  struct addrinfo *res;

  std::string port_str = std::to_string(port);
  int err = getaddrinfo(hostname.c_str(), port_str.c_str(), &hints, &res);

  if (err != 0 || res == NULL) {
    throw std::runtime_error("dns lookup failed");
  }

  int sockfd = socket(res->ai_family, res->ai_socktype, 0);
  if (sockfd < 0) {
    freeaddrinfo(res);
    throw std::runtime_error("failed to allocate socket");
  }

  if (connect(sockfd, res->ai_addr, res->ai_addrlen) != 0) {
    close(sockfd);
    freeaddrinfo(res);
    throw std::runtime_error("failed to connect");
  }

  freeaddrinfo(res);

  return sockfd;
}